

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

void __thiscall
kj::Vector<kj::Array<unsigned_char>_>::setCapacity
          (Vector<kj::Array<unsigned_char>_> *this,size_t newSize)

{
  ArrayDisposer *pAVar1;
  ArrayBuilder<kj::Array<unsigned_char>_> *pAVar2;
  size_t __length;
  size_t extraout_RDX;
  size_t size;
  undefined1 local_38 [8];
  ArrayBuilder<kj::Array<unsigned_char>_> newBuilder;
  size_t newSize_local;
  Vector<kj::Array<unsigned_char>_> *this_local;
  
  newBuilder.disposer = (ArrayDisposer *)newSize;
  pAVar1 = (ArrayDisposer *)ArrayBuilder<kj::Array<unsigned_char>_>::size(&this->builder);
  size = __length;
  if (newBuilder.disposer < pAVar1) {
    ArrayBuilder<kj::Array<unsigned_char>_>::truncate
              (&this->builder,(char *)newBuilder.disposer,__length);
    size = extraout_RDX;
  }
  heapArrayBuilder<kj::Array<unsigned_char>>
            ((ArrayBuilder<kj::Array<unsigned_char>_> *)local_38,(kj *)newBuilder.disposer,size);
  pAVar2 = mv<kj::ArrayBuilder<kj::Array<unsigned_char>>>(&this->builder);
  ArrayBuilder<kj::Array<unsigned_char>>::addAll<kj::ArrayBuilder<kj::Array<unsigned_char>>>
            ((ArrayBuilder<kj::Array<unsigned_char>> *)local_38,pAVar2);
  pAVar2 = mv<kj::ArrayBuilder<kj::Array<unsigned_char>>>
                     ((ArrayBuilder<kj::Array<unsigned_char>_> *)local_38);
  ArrayBuilder<kj::Array<unsigned_char>_>::operator=(&this->builder,pAVar2);
  ArrayBuilder<kj::Array<unsigned_char>_>::~ArrayBuilder
            ((ArrayBuilder<kj::Array<unsigned_char>_> *)local_38);
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }